

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNTests.cpp
# Opt level: O2

void __thiscall IsNotNaNTests::ThenIsNotNanXIsNotFalse<float>(IsNotNaNTests *this,float value)

{
  allocator local_12f;
  allocator local_12e;
  allocator local_12d;
  float local_12c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_12c = value;
  std::__cxx11::string::string((string *)&local_c8,"Is::Not::NaN(",&local_12d);
  std::__cxx11::string::string((string *)&local_e8,_str + (*_str == '*'),&local_12e);
  std::operator+(&local_a8,&local_c8,&local_e8);
  std::operator+(&local_88,&local_a8,": ");
  ut11::utility::ToString<float>(&local_108,&local_12c);
  std::operator+(&local_68,&local_88,&local_108);
  std::__cxx11::string::string((string *)&local_128,") is Not False",&local_12f);
  std::operator+(&local_48,&local_68,&local_128);
  local_28._8_8_ = 0;
  local_28._4_4_ = 0;
  local_28._0_4_ = local_12c;
  local_10 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/NaNTests.cpp:56:142)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/NaNTests.cpp:56:142)>
             ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  return;
}

Assistant:

void ThenIsNotNanXIsNotFalse(T value)
	{
		Then(std::string("Is::Not::NaN(") + std::string(typeid(T).name()) + ": " + ut11::utility::ToString(value) + std::string(") is Not False"), [value]() {
			AssertThat(ut11::Is::Not::NaN(value), ut11::Is::Not::False);
		});
	}